

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

bool __thiscall Rml::Event::GetParameter<bool>(Event *this,String *key,bool *default_value)

{
  bool bVar1;
  bool *default_value_local;
  String *key_local;
  Event *this_local;
  
  bVar1 = Get<bool>(&this->parameters,key,default_value);
  return bVar1;
}

Assistant:

T GetParameter(const String& key, const T& default_value) const
	{
		return Get(parameters, key, default_value);
	}